

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

bool __thiscall flatbuffers::BinaryAnnotator::ContainsSection(BinaryAnnotator *this,uint64_t offset)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  p_Var4 = (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = p_Var3;
  if (p_Var4 != (_Rb_tree_node_base *)0x0) {
    do {
      if (*(ulong *)(p_Var4 + 1) >= offset) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < offset];
    } while (p_Var4 != (_Base_ptr)0x0);
    bVar5 = p_Var2 != p_Var3;
    p_Var3 = p_Var2;
    if ((bVar5) && (*(uint64_t *)(p_Var2 + 1) == offset)) {
      return true;
    }
  }
  if ((p_Var3 == (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) ||
     (lVar1 = std::_Rb_tree_decrement(p_Var3), offset < *(ulong *)(lVar1 + 0x20))) {
    bVar5 = false;
  }
  else {
    bVar5 = offset < (ulong)(*(long *)(*(long *)(lVar1 + 0x58) + -0x98) +
                            *(long *)(*(long *)(lVar1 + 0x58) + -0xa0));
  }
  return bVar5;
}

Assistant:

bool BinaryAnnotator::ContainsSection(const uint64_t offset) {
  auto it = sections_.lower_bound(offset);
  // If the section is found, check that it is exactly equal its offset.
  if (it != sections_.end() && it->first == offset) { return true; }

  // If this was the first section, there are no other previous sections to
  // check.
  if (it == sections_.begin()) { return false; }

  // Go back one section.
  --it;

  // And check that if the offset is covered by the section.
  return offset >= it->first && offset < it->second.regions.back().offset +
                                             it->second.regions.back().length;
}